

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HessenbergDecomposition.h
# Opt level: O0

HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::HessenbergDecomposition<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::compute
          (HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,
          MatrixType *matrix)

{
  Index IVar1;
  MatrixType *matrix_local;
  HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->m_matrix,matrix);
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar1 < 2) {
    this->m_isInitialized = true;
  }
  else {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->m_hCoeffs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               IVar1 + -1,1);
    _compute(&this->m_matrix,&this->m_hCoeffs,&this->m_temp);
    this->m_isInitialized = true;
  }
  return this;
}

Assistant:

HessenbergDecomposition& compute(const MatrixType& matrix)
    {
      m_matrix = matrix;
      if(matrix.rows()<2)
      {
        m_isInitialized = true;
        return *this;
      }
      m_hCoeffs.resize(matrix.rows()-1,1);
      _compute(m_matrix, m_hCoeffs, m_temp);
      m_isInitialized = true;
      return *this;
    }